

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::CopyTexture
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,CopyTextureAttribs *CopyAttribs)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  COMMAND_QUEUE_TYPE in_DL;
  COMMAND_QUEUE_TYPE extraout_DL;
  char (*in_R9) [8];
  string msg;
  string local_58;
  String local_38;
  
  CVar2 = (this->m_Desc).QueueType;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_58,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"CopyTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x741);
      std::__cxx11::string::~string((string *)&local_58);
    }
    FormatString<char[97]>
              (&local_58,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"CopyTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x741);
    std::__cxx11::string::~string((string *)&local_58);
    CVar2 = (this->m_Desc).QueueType;
    in_DL = extraout_DL;
  }
  if ((CVar2 & COMMAND_QUEUE_TYPE_TRANSFER) == COMMAND_QUEUE_TYPE_UNKNOWN) {
    GetCommandQueueTypeString_abi_cxx11_(&local_38,(Diligent *)(ulong)CVar2,in_DL);
    FormatString<char[12],char[22],std::__cxx11::string,char[8]>
              (&local_58,(Diligent *)"CopyTexture",(char (*) [12])0x7e8bba,(char (*) [22])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&local_38);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"CopyTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x741);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if (CopyAttribs->pSrcTexture == (ITexture *)0x0) {
    FormatString<char[29]>(&local_58,(char (*) [29])"Src texture must not be null");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"CopyTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x742);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if (CopyAttribs->pDstTexture == (ITexture *)0x0) {
    FormatString<char[29]>(&local_58,(char (*) [29])"Dst texture must not be null");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"CopyTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x743);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0) {
    FormatString<char[57]>
              (&local_58,(char (*) [57])"CopyTexture command must be used outside of render pass.");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"CopyTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x744);
    std::__cxx11::string::~string((string *)&local_58);
  }
  ValidateCopyTextureParams(CopyAttribs);
  pUVar1 = &(this->m_Stats).CommandCounters.CopyTexture;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::CopyTexture(const CopyTextureAttribs& CopyAttribs)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_TRANSFER, "CopyTexture");
    DEV_CHECK_ERR(CopyAttribs.pSrcTexture, "Src texture must not be null");
    DEV_CHECK_ERR(CopyAttribs.pDstTexture, "Dst texture must not be null");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "CopyTexture command must be used outside of render pass.");

    ValidateCopyTextureParams(CopyAttribs);
    ++m_Stats.CommandCounters.CopyTexture;
}